

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O0

void GifSwapPixels(uint8_t *image,int pixA,int pixB)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t aB;
  uint8_t bB;
  uint8_t gB;
  uint8_t rB;
  uint8_t aA;
  uint8_t bA;
  uint8_t gA;
  uint8_t rA;
  int pixB_local;
  int pixA_local;
  uint8_t *image_local;
  
  uVar1 = image[pixA << 2];
  uVar2 = image[pixA * 4 + 1];
  uVar3 = image[pixA * 4 + 2];
  uVar4 = image[pixA * 4 + 3];
  uVar5 = image[pixB * 4 + 1];
  uVar6 = image[pixB * 4 + 2];
  uVar7 = image[pixA * 4 + 3];
  image[pixA << 2] = image[pixB << 2];
  image[pixA * 4 + 1] = uVar5;
  image[pixA * 4 + 2] = uVar6;
  image[pixA * 4 + 3] = uVar7;
  image[pixB << 2] = uVar1;
  image[pixB * 4 + 1] = uVar2;
  image[pixB * 4 + 2] = uVar3;
  image[pixB * 4 + 3] = uVar4;
  return;
}

Assistant:

void GifSwapPixels(uint8_t* image, int pixA, int pixB)
{
    uint8_t rA = image[pixA*4];
    uint8_t gA = image[pixA*4+1];
    uint8_t bA = image[pixA*4+2];
    uint8_t aA = image[pixA*4+3];

    uint8_t rB = image[pixB*4];
    uint8_t gB = image[pixB*4+1];
    uint8_t bB = image[pixB*4+2];
    uint8_t aB = image[pixA*4+3];

    image[pixA*4] = rB;
    image[pixA*4+1] = gB;
    image[pixA*4+2] = bB;
    image[pixA*4+3] = aB;

    image[pixB*4] = rA;
    image[pixB*4+1] = gA;
    image[pixB*4+2] = bA;
    image[pixB*4+3] = aA;
}